

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExpressionStatement(SyntaxDumper *this,ExpressionStatementSyntax *node)

{
  ExpressionStatementSyntax local_50 [56];
  
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x18));
  ExpressionStatementSyntax::semicolonToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitExpressionStatement(const ExpressionStatementSyntax* node) override
    {
        nonterminal(node->expression());
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }